

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPCDSK.cpp
# Opt level: O0

void __thiscall
Storage::Disk::CPCDSK::set_tracks
          (CPCDSK *this,
          map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
          *tracks)

{
  DataRate DVar1;
  bool bVar2;
  uint8_t uVar3;
  uint uVar4;
  int iVar5;
  reference ppVar6;
  element_type *track_00;
  size_t sVar7;
  reference ppVar8;
  Track *pTVar9;
  reference pvVar10;
  pointer pTVar11;
  reference pSVar12;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *pvVar13;
  reference pvVar14;
  size_type sVar15;
  long lVar16;
  ulong uVar17;
  size_type in_RCX;
  ulong __n;
  void *__buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *sample_2;
  iterator __end3_2;
  iterator __begin3_2;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *__range3_2;
  Sector *sector_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
  *__range2_3;
  long distance;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *sample_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *__range3_1;
  size_t data_size;
  Sector *sector_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
  *__range2_2;
  Track *track_2;
  size_t index_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *sample;
  iterator __end3;
  iterator __begin3;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *__range3;
  Sector *sector_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
  *__range2_1;
  size_t track_size;
  Track *track_1;
  size_t index;
  FileHolder output;
  Sector *sector;
  pair<const_unsigned_long,_Storage::Encodings::MFM::Sector> *source_sector;
  iterator __end2;
  iterator __begin2;
  map<unsigned_long,_Storage::Encodings::MFM::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
  *__range2;
  pointer local_f8;
  Track *track;
  size_t local_e8;
  size_t chronological_track;
  undefined8 local_d0;
  PCMSegment local_c8;
  undefined1 local_70 [8];
  map<unsigned_long,_Storage::Encodings::MFM::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
  sectors;
  bool is_double_density;
  pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_> *pair;
  const_iterator __end1;
  const_iterator __begin1;
  map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
  *__range1;
  map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
  *tracks_local;
  CPCDSK *this_local;
  
  __end1 = std::
           map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
           ::begin(tracks);
  pair = (pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_> *)
         std::
         map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
         ::end(tracks);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&pair), bVar2) {
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>
             ::operator*(&__end1);
    sectors._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
    track_00 = std::
               __shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&ppVar6->second);
    local_d0 = 0x186a000000001;
    track_serialisation(&local_c8,track_00,(Time)0x186a000000001);
    Encodings::MFM::sectors_from_segment
              ((map<unsigned_long,_Storage::Encodings::MFM::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
                *)local_70,&local_c8,Double);
    PCMSegment::~PCMSegment(&local_c8);
    track = *(Track **)&ppVar6->first;
    sVar7 = index_for_track(this,(Address)track);
    local_e8 = sVar7;
    in_RCX = std::
             vector<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>,_std::allocator<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>_>_>
             ::size(&this->tracks_);
    if (in_RCX <= sVar7) {
      std::
      vector<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>,_std::allocator<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>_>_>
      ::resize(&this->tracks_,local_e8 + 1);
      uVar4 = HeadPosition::as_int(&(ppVar6->first).position);
      in_RCX = (size_type)uVar4;
      this->head_position_count_ = uVar4;
    }
    pvVar10 = std::
              vector<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>,_std::allocator<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>_>_>
              ::operator[](&this->tracks_,local_e8);
    local_f8 = std::
               unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
               ::get(pvVar10);
    if (local_f8 == (pointer)0x0) {
      pTVar9 = (Track *)operator_new(0x28);
      Track::Track(pTVar9);
      local_f8 = pTVar9;
      iVar5 = HeadPosition::as_int(&(ppVar6->first).position);
      local_f8->track = (uint8_t)iVar5;
      uVar3 = (uint8_t)(ppVar6->first).head;
      in_RCX = CONCAT71((int7)(in_RCX >> 8),uVar3);
      local_f8->side = uVar3;
      local_f8->data_rate = SingleOrDoubleDensity;
      local_f8->data_encoding = MFM;
      local_f8->sector_length = '\x02';
      local_f8->gap3_length = 'N';
      local_f8->filler_byte = 0xe5;
      std::
      unique_ptr<Storage::Disk::CPCDSK::Track,std::default_delete<Storage::Disk::CPCDSK::Track>>::
      unique_ptr<std::default_delete<Storage::Disk::CPCDSK::Track>,void>
                ((unique_ptr<Storage::Disk::CPCDSK::Track,std::default_delete<Storage::Disk::CPCDSK::Track>>
                  *)&__range2,local_f8);
      pvVar10 = std::
                vector<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>,_std::allocator<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>_>_>
                ::operator[](&this->tracks_,local_e8);
      std::
      unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>::
      operator=(pvVar10,(unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                         *)&__range2);
      std::
      unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>::
      ~unique_ptr((unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                   *)&__range2);
    }
    std::
    vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
    ::clear(&local_f8->sectors);
    __end2 = std::
             map<unsigned_long,_Storage::Encodings::MFM::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
             ::begin((map<unsigned_long,_Storage::Encodings::MFM::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
                      *)local_70);
    source_sector =
         (pair<const_unsigned_long,_Storage::Encodings::MFM::Sector> *)
         std::
         map<unsigned_long,_Storage::Encodings::MFM::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
         ::end((map<unsigned_long,_Storage::Encodings::MFM::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
                *)local_70);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&source_sector), bVar2) {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>::
               operator*(&__end2);
      std::
      vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
      ::emplace_back<>(&local_f8->sectors);
      output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)
           std::
           vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
           ::back(&local_f8->sectors);
      uVar3 = (ppVar8->second).address.side;
      *(uint8_t *)
       &(output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next)->__prev =
           (ppVar8->second).address.track;
      *(uint8_t *)
       ((long)&(output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next)->__prev
       + 1) = uVar3;
      (((Sector *)
       &(output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next)->__prev)->
      address).sector = (ppVar8->second).address.sector;
      ((Sector *)
      &(output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next)->__prev)->size =
           (ppVar8->second).size;
      uVar17 = CONCAT71((int7)((ulong)ppVar8 >> 8),(ppVar8->second).has_data_crc_error) &
               0xffffffffffffff01;
      *(bool *)&((__pthread_internal_list *)
                ((long)output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next +
                0x20))->__prev = SUB81(uVar17,0);
      uVar17 = CONCAT71((int7)(uVar17 >> 8),(ppVar8->second).has_header_crc_error) &
               0xffffffffffffff01;
      *(bool *)((long)&((__pthread_internal_list *)
                       ((long)output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.
                              __next + 0x20))->__prev + 1) = SUB81(uVar17,0);
      in_RCX = CONCAT71((int7)(uVar17 >> 8),(ppVar8->second).is_deleted) & 0xffffffffffffff01;
      *(bool *)((long)&((__pthread_internal_list *)
                       ((long)output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.
                              __next + 0x20))->__prev + 2) = SUB81(in_RCX,0);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator=((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)&(output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next)->
                      __next,&(ppVar8->second).samples);
      *(undefined1 *)
       ((long)&output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next[2].__prev
       + 3) = 0;
      *(undefined1 *)
       ((long)&output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next[2].__prev
       + 4) = 0;
      if (((ppVar8->second).has_data_crc_error & 1U) != 0) {
        uVar4 = *(byte *)((long)&output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list
                                 .__next[2].__prev + 4) | 0x20;
        in_RCX = (size_type)uVar4;
        *(char *)((long)&output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next
                         [2].__prev + 4) = (char)uVar4;
      }
      if (((ppVar8->second).has_header_crc_error & 1U) != 0) {
        uVar4 = *(byte *)((long)&output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list
                                 .__next[2].__prev + 3) | 0x20;
        in_RCX = (size_type)uVar4;
        *(char *)((long)&output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next
                         [2].__prev + 3) = (char)uVar4;
      }
      if (((ppVar8->second).is_deleted & 1U) != 0) {
        uVar4 = *(byte *)((long)&output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list
                                 .__next[2].__prev + 4) | 0x40;
        in_RCX = (size_type)uVar4;
        *(char *)((long)&output.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next
                         [2].__prev + 4) = (char)uVar4;
      }
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>::
      operator++(&__end2);
    }
    std::
    map<unsigned_long,_Storage::Encodings::MFM::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
    ::~map((map<unsigned_long,_Storage::Encodings::MFM::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::MFM::Sector>_>_>
            *)local_70);
    std::
    _Rb_tree_const_iterator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>
    ::operator++(&__end1);
  }
  FileHolder::FileHolder((FileHolder *)&index,&this->file_name_,Rewrite);
  FileHolder::write((FileHolder *)&index,0xa709b8,(void *)0x22,in_RCX);
  FileHolder::write((FileHolder *)&index,0xa709db,(void *)0xe,in_RCX);
  FileHolder::put8((FileHolder *)&index,(uint8_t)this->head_position_count_);
  FileHolder::put8((FileHolder *)&index,(uint8_t)this->head_count_);
  FileHolder::putn((FileHolder *)&index,2,'\0');
  for (track_1 = (Track *)0x0;
      track_1 < (Track *)(long)(this->head_position_count_ * this->head_count_);
      track_1 = (Track *)&track_1->side) {
    pTVar9 = (Track *)std::
                      vector<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>,_std::allocator<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>_>_>
                      ::size(&this->tracks_);
    if (track_1 < pTVar9) {
      pvVar10 = std::
                vector<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>,_std::allocator<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>_>_>
                ::operator[](&this->tracks_,(size_type)track_1);
      pTVar11 = std::
                unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                ::get(pvVar10);
      if (pTVar11 == (pointer)0x0) {
        FileHolder::put8((FileHolder *)&index,'\0');
      }
      else {
        __range2_1 = (vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
                      *)0x100;
        __end2_1 = std::
                   vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
                   ::begin(&pTVar11->sectors);
        sector_1 = (Sector *)
                   std::
                   vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
                   ::end(&pTVar11->sectors);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_1,
                                  (__normal_iterator<Storage::Disk::CPCDSK::Track::Sector_*,_std::vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>_>
                                   *)&sector_1), bVar2) {
          pSVar12 = __gnu_cxx::
                    __normal_iterator<Storage::Disk::CPCDSK::Track::Sector_*,_std::vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>_>
                    ::operator*(&__end2_1);
          pvVar13 = &(pSVar12->super_Sector).samples;
          __end3 = std::
                   vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::begin(pvVar13);
          sample = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   std::
                   vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::end(pvVar13);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                             *)&sample), bVar2) {
            pvVar14 = __gnu_cxx::
                      __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::operator*(&__end3);
            sVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar14);
            __range2_1 = (vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
                          *)((long)&(__range2_1->
                                    super__Vector_base<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
                                    )._M_impl.super__Vector_impl_data._M_start + sVar15);
            __gnu_cxx::
            __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::operator++(&__end3);
          }
          __gnu_cxx::
          __normal_iterator<Storage::Disk::CPCDSK::Track::Sector_*,_std::vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>_>
          ::operator++(&__end2_1);
        }
        __range2_1._1_1_ =
             (uint8_t)((long)&(__range2_1->
                              super__Vector_base<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
                              )._M_impl.super__Vector_impl_data._M_start +
                       (ulong)(0x100U - (int)__range2_1 & 0xff) >> 8);
        FileHolder::put8((FileHolder *)&index,__range2_1._1_1_);
      }
    }
    else {
      FileHolder::put8((FileHolder *)&index,'\0');
    }
  }
  lVar16 = FileHolder::tell((FileHolder *)&index);
  FileHolder::putn((FileHolder *)&index,0x100 - lVar16,'\0');
  for (track_2 = (Track *)0x0;
      track_2 < (Track *)(long)(this->head_position_count_ * this->head_count_);
      track_2 = (Track *)&track_2->side) {
    pTVar9 = (Track *)std::
                      vector<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>,_std::allocator<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>_>_>
                      ::size(&this->tracks_);
    if (track_2 < pTVar9) {
      pvVar10 = std::
                vector<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>,_std::allocator<std::unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>_>_>
                ::operator[](&this->tracks_,(size_type)track_2);
      pTVar11 = std::
                unique_ptr<Storage::Disk::CPCDSK::Track,_std::default_delete<Storage::Disk::CPCDSK::Track>_>
                ::get(pvVar10);
      if (pTVar11 != (pointer)0x0) {
        FileHolder::write((FileHolder *)&index,0xa709ea,(void *)0xd,(size_t)pTVar9);
        FileHolder::putn((FileHolder *)&index,3,'\0');
        FileHolder::put8((FileHolder *)&index,pTVar11->track);
        FileHolder::put8((FileHolder *)&index,pTVar11->side);
        DVar1 = pTVar11->data_rate;
        if (DVar1 == SingleOrDoubleDensity) {
          FileHolder::put8((FileHolder *)&index,'\x01');
        }
        else if (DVar1 == HighDensity) {
          FileHolder::put8((FileHolder *)&index,'\x02');
        }
        else if (DVar1 == ExtendedDensity) {
          FileHolder::put8((FileHolder *)&index,'\x03');
        }
        else {
          FileHolder::put8((FileHolder *)&index,'\0');
        }
        if (pTVar11->data_encoding == FM) {
          FileHolder::put8((FileHolder *)&index,'\x01');
        }
        else if (pTVar11->data_encoding == MFM) {
          FileHolder::put8((FileHolder *)&index,'\x02');
        }
        else {
          FileHolder::put8((FileHolder *)&index,'\0');
        }
        FileHolder::put8((FileHolder *)&index,pTVar11->sector_length);
        sVar15 = std::
                 vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
                 ::size(&pTVar11->sectors);
        FileHolder::put8((FileHolder *)&index,(uint8_t)sVar15);
        FileHolder::put8((FileHolder *)&index,pTVar11->gap3_length);
        FileHolder::put8((FileHolder *)&index,pTVar11->filler_byte);
        __end2_2 = std::
                   vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
                   ::begin(&pTVar11->sectors);
        sector_2 = (Sector *)
                   std::
                   vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
                   ::end(&pTVar11->sectors);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_2,
                                  (__normal_iterator<Storage::Disk::CPCDSK::Track::Sector_*,_std::vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>_>
                                   *)&sector_2), bVar2) {
          pSVar12 = __gnu_cxx::
                    __normal_iterator<Storage::Disk::CPCDSK::Track::Sector_*,_std::vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>_>
                    ::operator*(&__end2_2);
          FileHolder::put8((FileHolder *)&index,(pSVar12->super_Sector).address.track);
          FileHolder::put8((FileHolder *)&index,(pSVar12->super_Sector).address.side);
          FileHolder::put8((FileHolder *)&index,(pSVar12->super_Sector).address.sector);
          FileHolder::put8((FileHolder *)&index,(pSVar12->super_Sector).size);
          FileHolder::put8((FileHolder *)&index,(pSVar12->super_Sector).field_0x23);
          FileHolder::put8((FileHolder *)&index,(pSVar12->super_Sector).field_0x24);
          __range3_1 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)0x0;
          pvVar13 = &(pSVar12->super_Sector).samples;
          __end3_1 = std::
                     vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::begin(pvVar13);
          sample_1 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     std::
                     vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::end(pvVar13);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3_1,
                                    (__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                     *)&sample_1), bVar2) {
            pvVar14 = __gnu_cxx::
                      __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::operator*(&__end3_1);
            sVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar14);
            __range3_1 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)((long)&(__range3_1->
                                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + sVar15);
            __gnu_cxx::
            __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::operator++(&__end3_1);
          }
          FileHolder::put16le((FileHolder *)&index,(uint16_t)__range3_1);
          __gnu_cxx::
          __normal_iterator<Storage::Disk::CPCDSK::Track::Sector_*,_std::vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>_>
          ::operator++(&__end2_2);
        }
        uVar17 = FileHolder::tell((FileHolder *)&index);
        __n = uVar17 & 0xffffffff;
        FileHolder::putn((FileHolder *)&index,(ulong)(0x100U - (int)uVar17 & 0xff),'\0');
        __end2_3 = std::
                   vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
                   ::begin(&pTVar11->sectors);
        sector_3 = (Sector *)
                   std::
                   vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>
                   ::end(&pTVar11->sectors);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_3,
                                  (__normal_iterator<Storage::Disk::CPCDSK::Track::Sector_*,_std::vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>_>
                                   *)&sector_3), bVar2) {
          pSVar12 = __gnu_cxx::
                    __normal_iterator<Storage::Disk::CPCDSK::Track::Sector_*,_std::vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>_>
                    ::operator*(&__end2_3);
          pvVar13 = &(pSVar12->super_Sector).samples;
          __end3_2 = std::
                     vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::begin(pvVar13);
          sample_2 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     std::
                     vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::end(pvVar13);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3_2,
                                    (__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                     *)&sample_2), bVar2) {
            pvVar14 = __gnu_cxx::
                      __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::operator*(&__end3_2);
            FileHolder::write((FileHolder *)&index,(int)pvVar14,__buf,__n);
            __gnu_cxx::
            __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::operator++(&__end3_2);
          }
          __gnu_cxx::
          __normal_iterator<Storage::Disk::CPCDSK::Track::Sector_*,_std::vector<Storage::Disk::CPCDSK::Track::Sector,_std::allocator<Storage::Disk::CPCDSK::Track::Sector>_>_>
          ::operator++(&__end2_3);
        }
        lVar16 = FileHolder::tell((FileHolder *)&index);
        FileHolder::putn((FileHolder *)&index,(ulong)(0x100U - (int)lVar16 & 0xff),'\0');
      }
    }
  }
  FileHolder::~FileHolder((FileHolder *)&index);
  return;
}

Assistant:

void CPCDSK::set_tracks(const std::map<::Storage::Disk::Track::Address, std::shared_ptr<::Storage::Disk::Track>> &tracks) {
	// Patch changed tracks into the disk image.
	for(auto &pair: tracks) {
		// Assume MFM for now; with extensions DSK can contain FM tracks.
		const bool is_double_density = true;
		std::map<std::size_t, Storage::Encodings::MFM::Sector> sectors =
			Storage::Encodings::MFM::sectors_from_segment(
				Storage::Disk::track_serialisation(*pair.second, is_double_density ? Storage::Encodings::MFM::MFMBitLength : Storage::Encodings::MFM::FMBitLength),
				Storage::Encodings::MFM::Density::Double);

		// Find slot for track, making it if neccessary.
		const std::size_t chronological_track = index_for_track(pair.first);
		if(chronological_track >= tracks_.size()) {
			tracks_.resize(chronological_track+1);
			head_position_count_ = pair.first.position.as_int();
		}

		// Get the track, or create it if necessary.
		Track *track = tracks_[chronological_track].get();
		if(!track) {
			track = new Track;
			track->track = uint8_t(pair.first.position.as_int());
			track->side = uint8_t(pair.first.head);
			track->data_rate = Track::DataRate::SingleOrDoubleDensity;
			track->data_encoding = Track::DataEncoding::MFM;
			track->sector_length = 2;
			track->gap3_length = 78;
			track->filler_byte = 0xe5;

			tracks_[chronological_track] = std::unique_ptr<Track>(track);
		}

		// Store sectors.
		track->sectors.clear();
		for(auto &source_sector: sectors) {
			track->sectors.emplace_back();
			Track::Sector &sector = track->sectors.back();

			sector.address = source_sector.second.address;
			sector.size = source_sector.second.size;
			sector.has_data_crc_error = source_sector.second.has_data_crc_error;
			sector.has_header_crc_error = source_sector.second.has_header_crc_error;
			sector.is_deleted = source_sector.second.is_deleted;
			sector.samples = std::move(source_sector.second.samples);

			sector.fdc_status1 = 0;
			sector.fdc_status2 = 0;

			if(source_sector.second.has_data_crc_error)		sector.fdc_status2 |= 0x20;
			if(source_sector.second.has_header_crc_error)	sector.fdc_status1 |= 0x20;
			if(source_sector.second.is_deleted)				sector.fdc_status2 |= 0x40;
		}
	}

	// Rewrite the entire disk image, in extended form.
	Storage::FileHolder output(file_name_, Storage::FileHolder::FileMode::Rewrite);
	output.write(reinterpret_cast<const uint8_t *>("EXTENDED CPC DSK File\r\nDisk-Info\r\n"), 34);
	output.write(reinterpret_cast<const uint8_t *>("Clock Signal  "), 14);
	output.put8(uint8_t(head_position_count_));
	output.put8(uint8_t(head_count_));
	output.putn(2, 0);

	// Output size table.
	for(std::size_t index = 0; index < size_t(head_position_count_ * head_count_); ++index) {
		if(index >= tracks_.size()) {
			output.put8(0);
			continue;
		}
		Track *track = tracks_[index].get();
		if(!track) {
			output.put8(0);
			continue;
		}

		// Calculate size of track.
		std::size_t track_size = 256;
		for(auto &sector: track->sectors) {
			for(auto &sample: sector.samples) {
				track_size += sample.size();
			}
		}

		// Round upward and output.
		track_size += (256 - (track_size & 255)) & 255;
		output.put8(uint8_t(track_size >> 8));
	}

	// Advance to offset 256.
	output.putn(size_t(256 - output.tell()), 0);

	// Output each track.
	for(std::size_t index = 0; index < size_t(head_position_count_ * head_count_); ++index) {
		if(index >= tracks_.size()) continue;
		Track *const track = tracks_[index].get();
		if(!track) continue;

		// Output track header.
		output.write(reinterpret_cast<const uint8_t *>("Track-Info\r\n"), 13);
		output.putn(3, 0);
		output.put8(track->track);
		output.put8(track->side);
		switch (track->data_rate) {
			default:
				output.put8(0);
			break;
			case Track::DataRate::SingleOrDoubleDensity:
				output.put8(1);
			break;
			case Track::DataRate::HighDensity:
				output.put8(2);
			break;
			case Track::DataRate::ExtendedDensity:
				output.put8(3);
			break;
		}
		switch (track->data_encoding) {
			default:
				output.put8(0);
			break;
			case Track::DataEncoding::FM:
				output.put8(1);
			break;
			case Track::DataEncoding::MFM:
				output.put8(2);
			break;
		}
		output.put8(track->sector_length);
		output.put8(uint8_t(track->sectors.size()));
		output.put8(track->gap3_length);
		output.put8(track->filler_byte);

		// Output sector information list.
		for(auto &sector: track->sectors) {
			output.put8(sector.address.track);
			output.put8(sector.address.side);
			output.put8(sector.address.sector);
			output.put8(sector.size);
			output.put8(sector.fdc_status1);
			output.put8(sector.fdc_status2);

			std::size_t data_size = 0;
			for(auto &sample: sector.samples) {
				data_size += sample.size();
			}
			output.put16le(uint16_t(data_size));
		}

		// Move to next 256-byte boundary.
		long distance = (256 - (output.tell()&255))&255;
		output.putn(size_t(distance), 0);

		// Output sector contents.
		for(auto &sector: track->sectors) {
			for(auto &sample: sector.samples) {
				output.write(sample);
			}
		}

		// Move to next 256-byte boundary.
		distance = (256 - (output.tell()&255))&255;
		output.putn(size_t(distance), 0);
	}
}